

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.h
# Opt level: O2

int __thiscall
soplex::SPxHarrisRT<double>::clone
          (SPxHarrisRT<double> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SPxHarrisRT<double> *this_00;
  
  this_00 = (SPxHarrisRT<double> *)operator_new(0x38);
  SPxHarrisRT(this_00,this);
  return (int)this_00;
}

Assistant:

inline virtual SPxRatioTester<R>* clone() const
   {
      return new SPxHarrisRT(*this);
   }